

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsEval.c
# Opt level: O2

void PostfixExpression_dec_eval(JsAstNode *na,JsContext *context,JsValue *res)

{
  JsValue *res_00;
  undefined1 local_80 [8];
  JsValue r1;
  JsValue r2;
  JsValue r3;
  JsValue v0;
  
  (*JsNodeClassEval[(*(JsAstNode **)(na + 1))->astClass])
            (*(JsAstNode **)(na + 1),context,(JsValue *)local_80);
  res_00 = (JsValue *)((long)&r1.u + 8);
  JsGetValue((JsValue *)local_80,res_00);
  JsToNumber(res_00,res);
  r2.u.completion.type = JS_COMPLETION_RETURN;
  r3._0_8_ = (res->u).number + -1.0;
  JsPutValue((JsValue *)local_80,(JsValue *)((long)&r2.u + 8),(JsValue *)((long)&r3.u + 8));
  return;
}

Assistant:

static void
PostfixExpression_dec_eval(na, context, res)
	struct JsAstNode *na; /* (struct JsAstUnaryNode) */
	struct JsContext *context;
	struct JsValue *res;
{
	struct JsAstUnaryNode *n = CAST_NODE(na, JsAstUnaryNode);
	struct JsValue r1, r2, r3, v0;

	EVAL(n->a, context, &r1);
	JsGetValue( &r1, &r2);
	JsToNumber( &r2, res);
	r3.type = JS_NUMBER;
	r3.u.number = res->u.number - 1;
	JsPutValue( &r1, &r3, &v0);
}